

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O2

int GetVoltageSSC32(SSC32 *pSSC32,int channel,double *pVoltage)

{
  int iVar1;
  size_t sVar2;
  char recvbuf [1];
  char sendbuf [512];
  
  if ((uint)channel < 4) {
    memset(sendbuf,0,0x200);
    sprintf(sendbuf,"V%c\r",(ulong)(channel + 0x41));
    sVar2 = strlen(sendbuf);
    iVar1 = WriteDataSSC32(pSSC32,(uint8 *)sendbuf,(int)sVar2,pSSC32->bytedelayus);
    if (iVar1 == 0) {
      if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
        fwrite(sendbuf,(long)(int)sVar2,1,(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      recvbuf[0] = '\0';
      iVar1 = ReadAllRS232Port(&pSSC32->RS232Port,(uint8 *)recvbuf,1);
      if (iVar1 != 0) {
        puts("Error reading data from a SSC32. ");
        return 1;
      }
      if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
        fputc((int)recvbuf[0],(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      *pVoltage = (double)(byte)recvbuf[0] * 5.0 * 0.00390625;
      return 0;
    }
    puts("Error writing data to a SSC32. ");
  }
  else {
    printf("Invalid parameter : channel %d.\n",channel);
  }
  return 1;
}

Assistant:

inline int GetVoltageSSC32(SSC32* pSSC32, int channel, double* pVoltage)
{
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;
	char recvbuf[1];
	int recvbuflen = 0;
	char c = 0;
	unsigned char v = 0;

	switch (channel)
	{
	case 0: c = 'A'; break;
	case 1: c = 'B'; break;
	case 2: c = 'C'; break;
	case 3: c = 'D'; break;
	default: 
		printf("Invalid parameter : channel %d.\n", channel);
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "V%c\r", c);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 1;

	if (ReadAllRS232Port(&pSSC32->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	v = (unsigned char)recvbuf[0];
	*pVoltage = v*5.0/256.0;

	return EXIT_SUCCESS;
}